

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O1

float quad_decode(apriltag_detector_t *td,apriltag_family_t *family,image_u8_t *im,quad *quad,
                 quick_decode_entry *entry,image_u8_t *im_samples)

{
  float fVar1;
  byte bVar2;
  uint32_t uVar3;
  matd_t *pmVar4;
  ulong uVar5;
  uint64_t uVar6;
  quick_decode_entry *pqVar7;
  apriltag_detector_t *td_00;
  int pattern_idx;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  double *pdVar19;
  ulong uVar20;
  uint64_t *puVar21;
  bool bVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  double dVar28;
  double dVar29;
  undefined8 uStack_260;
  undefined8 uStack_258;
  float patterns [40];
  graymodel local_138;
  apriltag_detector_t *local_b8;
  undefined1 *local_b0;
  image_u8_t *local_a8;
  quick_decode_entry *local_a0;
  double local_98;
  double local_90;
  int local_84;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  uStack_258 = 0x3f000000bf000000;
  patterns[0] = 0.0;
  patterns[1] = 1.0;
  patterns[2] = 1.0;
  patterns[3] = 0.5;
  patterns[4] = 0.5;
  patterns[5] = 0.0;
  patterns[6] = 1.0;
  patterns[7] = 0.0;
  patterns[8] = (float)family->width_at_border + 0.5;
  patterns[0xd] = (float)family->width_at_border + -0.5;
  patterns[9] = 0.5;
  patterns[10] = 0.0;
  patterns[0xb] = 1.0;
  patterns[0xc] = 1.0;
  patterns[0xe] = 0.5;
  patterns[0xf] = 0.0;
  patterns[0x10] = 1.0;
  patterns[0x11] = 0.0;
  patterns[0x12] = 0.5;
  patterns[0x13] = -0.5;
  patterns[0x14] = 1.0;
  patterns[0x15] = 0.0;
  patterns[0x16] = 1.0;
  patterns[0x17] = 0.5;
  patterns[0x18] = 0.5;
  patterns[0x19] = 1.0;
  lVar10 = 0;
  patterns[0x1a] = 0.0;
  patterns[0x1b] = 0.0;
  patterns[0x1c] = 0.5;
  patterns[0x1d] = patterns[8];
  patterns[0x1e] = 1.0;
  patterns[0x1f] = 0.0;
  patterns[0x20] = 1.0;
  patterns[0x21] = 0.5;
  patterns[0x22] = patterns[0xd];
  patterns[0x23] = 1.0;
  patterns[0x24] = 0.0;
  patterns[0x25] = 0.0;
  local_138.A[1][0] = 0.0;
  local_138.A[2][0] = 0.0;
  local_138.A[2][1] = 0.0;
  local_138.C[0] = 0.0;
  local_138.C[1] = 0.0;
  local_138.C[2] = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_38 = (double *)0x0;
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_40 = 0.0;
  do {
    iVar14 = family->width_at_border;
    if (0 < iVar14) {
      fVar23 = patterns[lVar10 * 5 + 2];
      fVar25 = patterns[lVar10 * 5 + -2];
      fVar26 = patterns[lVar10 * 5 + -1];
      local_98 = (double)CONCAT44(local_98._4_4_,fVar26);
      fVar27 = patterns[lVar10 * 5];
      fVar1 = patterns[lVar10 * 5 + 1];
      iVar16 = 0;
      local_90 = (double)CONCAT44(local_90._4_4_,fVar25);
      do {
        dVar29 = (double)(((float)iVar16 * fVar27 + fVar25) / (float)iVar14) + -0.5;
        dVar29 = dVar29 + dVar29;
        dVar28 = (double)(((float)iVar16 * fVar1 + fVar26) / (float)iVar14) + -0.5;
        dVar28 = dVar28 + dVar28;
        pmVar4 = quad->H;
        uVar12 = pmVar4->ncols;
        dVar24 = (double)pmVar4[(ulong)(uVar12 * 2) + 1] * dVar29 +
                 (double)pmVar4[(ulong)(uVar12 * 2) + 2] * dVar28 +
                 (double)pmVar4[(ulong)(uVar12 * 2 + 2) + 1];
        iVar14 = (int)(((double)pmVar4[1] * dVar29 + (double)pmVar4[2] * dVar28 + (double)pmVar4[3])
                      / dVar24);
        if ((((-1 < iVar14) &&
             (iVar17 = (int)(((double)pmVar4[(ulong)uVar12 + 1] * dVar29 +
                              (double)pmVar4[(ulong)(uVar12 + 1) + 1] * dVar28 +
                             (double)pmVar4[(ulong)(uVar12 + 2) + 1]) / dVar24), -1 < iVar17)) &&
            (iVar14 < im->width)) && (iVar17 < im->height)) {
          bVar2 = im->buf[im->stride * iVar17 + iVar14];
          if (im_samples != (image_u8_t *)0x0) {
            im_samples->buf[iVar17 * im_samples->stride + iVar14] = (char)(int)fVar23 + 0xff;
          }
          dVar24 = (double)bVar2;
          if ((int)fVar23 == 0) {
            local_40 = local_40 + dVar29 * dVar29;
            local_48 = local_48 + dVar29 * dVar28;
            local_50 = local_50 + dVar29;
            local_58 = local_58 + dVar28 * dVar28;
            local_60 = local_60 + dVar28;
            local_68 = local_68 + 1.0;
            local_38 = (double *)((double)local_38 + dVar29 * dVar24);
            local_70 = local_70 + dVar28 * dVar24;
            local_78 = local_78 + dVar24;
          }
          else {
            local_80 = local_80 + dVar29 * dVar29;
          }
        }
        iVar16 = iVar16 + 1;
        iVar14 = family->width_at_border;
      } while (iVar16 < iVar14);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  local_138.A[0][1] = local_48;
  local_138.A[0][2] = local_50;
  local_138.A[1][1] = local_58;
  local_138.A[1][2] = local_60;
  local_138.A[2][2] = local_68;
  local_138.B[0] = (double)local_38;
  local_138.B[1] = local_70;
  local_138.B[2] = local_78;
  patterns._152_8_ = local_80;
  local_138.A[0][0] = local_40;
  uStack_260 = 0x1099ad;
  local_b8 = td;
  local_a8 = im_samples;
  local_a0 = entry;
  graymodel_solve((graymodel *)(patterns + 0x26));
  uStack_260 = 0x1099b5;
  graymodel_solve(&local_138);
  local_60 = 0.0;
  local_68 = 0.0;
  local_58 = 0.0;
  local_48 = local_138.C[1];
  local_50 = local_138.C[0];
  local_40 = local_138.C[2];
  if (family->reversed_border == 0.0 < local_138.C[0] * 0.0 + local_138.C[1] * 0.0 + local_138.C[2])
  {
    lVar10 = -((ulong)(uint)(family->total_width * family->total_width) * 8 + 0xf & 0x7fffffff0);
    pdVar19 = (double *)((long)patterns + lVar10 + -8);
    iVar14 = family->total_width;
    local_b0 = (undefined1 *)&uStack_258;
    local_38 = pdVar19;
    *(undefined8 *)((long)&uStack_260 + lVar10) = 0x109a70;
    memset(pdVar19,0,(ulong)(uint)(iVar14 * iVar14) << 3);
    uVar13 = (ulong)family->nbits;
    local_84 = (family->width_at_border - iVar14) / 2;
    if (family->nbits != 0) {
      uVar15 = 0;
      do {
        uVar3 = family->bit_y[uVar15];
        local_80 = (double)CONCAT44(local_80._4_4_,family->bit_x[uVar15]);
        dVar24 = ((double)(int)family->bit_x[uVar15] + 0.5) / (double)family->width_at_border + -0.5
        ;
        local_98 = dVar24 + dVar24;
        dVar24 = ((double)(int)uVar3 + 0.5) / (double)family->width_at_border + -0.5;
        local_90 = dVar24 + dVar24;
        pmVar4 = quad->H;
        uVar12 = pmVar4->ncols;
        dVar24 = (double)pmVar4[(ulong)(uVar12 * 2) + 1] * local_98 +
                 (double)pmVar4[(ulong)(uVar12 * 2) + 2] * local_90 +
                 (double)pmVar4[(ulong)(uVar12 * 2 + 2) + 1];
        dVar28 = ((double)pmVar4[1] * local_98 + (double)pmVar4[2] * local_90 + (double)pmVar4[3]) /
                 dVar24;
        dVar24 = ((double)pmVar4[(ulong)uVar12 + 1] * local_98 +
                  (double)pmVar4[(ulong)(uVar12 + 1) + 1] * local_90 +
                 (double)pmVar4[(ulong)(uVar12 + 2) + 1]) / dVar24;
        local_78 = dVar28;
        local_70 = dVar24;
        *(undefined8 *)((long)&uStack_260 + lVar10) = 0x109b86;
        dVar24 = value_for_pixel(im,dVar28,dVar24);
        if ((dVar24 != -1.0) || (NAN(dVar24))) {
          dVar28 = (local_98 * local_68 + local_90 * local_60 + local_58 +
                   local_50 * local_98 + local_48 * local_90 + local_40) * 0.5;
          local_38[(int)((local_80._0_4_ - local_84) + (uVar3 - local_84) * family->total_width)] =
               dVar24 - dVar28;
          if (local_a8 != (image_u8_t *)0x0) {
            local_a8->buf[(int)local_70 * local_a8->stride + (int)local_78] = -(dVar24 < dVar28);
          }
        }
        uVar15 = uVar15 + 1;
        uVar13 = (ulong)family->nbits;
      } while (uVar15 < uVar13);
    }
    pdVar19 = local_38;
    pqVar7 = local_a0;
    td_00 = local_b8;
    iVar14 = family->total_width;
    *(undefined8 *)((long)&uStack_260 + lVar10) = 0x109c6f;
    sharpen(td_00,pdVar19,iVar14);
    iVar16 = 0;
    uVar12 = (uint)uVar13;
    if (uVar12 == 0) {
      fVar26 = 0.0;
      fVar27 = 1.0;
      fVar23 = 1.0;
      fVar25 = 0.0;
      uVar15 = 0;
    }
    else {
      fVar25 = 0.0;
      uVar20 = 0;
      uVar15 = 0;
      fVar26 = 0.0;
      fVar23 = 1.0;
      fVar27 = 1.0;
      do {
        uVar15 = uVar15 * 2;
        dVar24 = pdVar19[(int)((family->bit_x[uVar20] - local_84) +
                              (family->bit_y[uVar20] - local_84) * iVar14)];
        if (dVar24 <= 0.0) {
          fVar25 = (float)((double)fVar25 - dVar24);
          fVar23 = fVar23 + 1.0;
        }
        else {
          fVar26 = (float)(dVar24 + (double)fVar26);
          fVar27 = fVar27 + 1.0;
          uVar15 = uVar15 | 1;
        }
        uVar20 = uVar20 + 1;
      } while (uVar13 != uVar20);
    }
    iVar14 = *family->impl;
    lVar10 = *(long *)((long)family->impl + 8);
    bVar22 = (uVar12 & 0x80000003) == 1;
    uVar18 = (uint)bVar22;
    iVar8 = uVar12 - uVar18;
    iVar17 = (uVar12 - uVar18) + 3;
    if (-1 < iVar8) {
      iVar17 = iVar8;
    }
    iVar9 = iVar8 * 3 + 3;
    if (-1 < iVar8 * 3) {
      iVar9 = iVar8 * 3;
    }
    do {
      uVar20 = uVar15 % (ulong)(long)iVar14;
      while( true ) {
        lVar11 = (long)(int)uVar20 * 0x10;
        uVar5 = *(ulong *)(lVar10 + lVar11);
        if (uVar5 == 0xffffffffffffffff) break;
        if (uVar5 == uVar15) {
          puVar21 = (uint64_t *)(lVar10 + lVar11);
          uVar6 = puVar21[1];
          pqVar7->rcode = *puVar21;
          pqVar7->id = (short)uVar6;
          pqVar7->hamming = (char)(uVar6 >> 0x10);
          pqVar7->rotation = (char)(uVar6 >> 0x18);
          *(int *)&pqVar7->field_0xc = (int)(uVar6 >> 0x20);
          goto LAB_00109e00;
        }
        uVar20 = (long)((int)uVar20 + 1) % (long)iVar14 & 0xffffffff;
      }
      uVar15 = ((ulong)((uint)uVar15 & uVar18) |
                (uVar15 >> bVar22) << ((char)(iVar17 >> 2) + bVar22 & 0x3fU) |
               (uVar15 >> ((char)(iVar9 >> 2) + bVar22 & 0x3fU)) << bVar22) &
               ~(-1L << ((byte)uVar13 & 0x3f));
      iVar16 = iVar16 + 1;
    } while (iVar16 != 4);
    pqVar7->rcode = 0;
    pqVar7->id = 0xffff;
    pqVar7->hamming = 0xff;
    iVar16 = 0;
LAB_00109e00:
    pqVar7->rotation = (uint8_t)iVar16;
    fVar26 = fVar26 / fVar27;
    fVar25 = fVar25 / fVar23;
    fVar23 = fVar25;
    if (fVar26 <= fVar25) {
      fVar23 = fVar26;
    }
    fVar23 = (float)(~-(uint)NAN(fVar26) & (uint)fVar23 | -(uint)NAN(fVar26) & (uint)fVar25);
  }
  else {
    fVar23 = -1.0;
  }
  return fVar23;
}

Assistant:

float quad_decode(apriltag_detector_t* td, apriltag_family_t *family, image_u8_t *im, struct quad *quad, struct quick_decode_entry *entry, image_u8_t *im_samples)
{
    // decode the tag binary contents by sampling the pixel
    // closest to the center of each bit cell.

    // We will compute a threshold by sampling known white/black cells around this tag.
    // This sampling is achieved by considering a set of samples along lines.
    //
    // coordinates are given in bit coordinates. ([0, fam->border_width]).
    //
    // { initial x, initial y, delta x, delta y, WHITE=1 }
    float patterns[] = {
        // left white column
        -0.5, 0.5,
        0, 1,
        1,

        // left black column
        0.5, 0.5,
        0, 1,
        0,

        // right white column
        family->width_at_border + 0.5, .5,
        0, 1,
        1,

        // right black column
        family->width_at_border - 0.5, .5,
        0, 1,
        0,

        // top white row
        0.5, -0.5,
        1, 0,
        1,

        // top black row
        0.5, 0.5,
        1, 0,
        0,

        // bottom white row
        0.5, family->width_at_border + 0.5,
        1, 0,
        1,

        // bottom black row
        0.5, family->width_at_border - 0.5,
        1, 0,
        0

        // XXX double-counts the corners.
    };

    struct graymodel whitemodel, blackmodel;
    graymodel_init(&whitemodel);
    graymodel_init(&blackmodel);

    for (int pattern_idx = 0; pattern_idx < sizeof(patterns)/(5*sizeof(float)); pattern_idx ++) {
        float *pattern = &patterns[pattern_idx * 5];

        int is_white = pattern[4];

        for (int i = 0; i < family->width_at_border; i++) {
            double tagx01 = (pattern[0] + i*pattern[2]) / (family->width_at_border);
            double tagy01 = (pattern[1] + i*pattern[3]) / (family->width_at_border);

            double tagx = 2*(tagx01-0.5);
            double tagy = 2*(tagy01-0.5);

            double px, py;
            homography_project(quad->H, tagx, tagy, &px, &py);

            // don't round
            int ix = px;
            int iy = py;
            if (ix < 0 || iy < 0 || ix >= im->width || iy >= im->height)
                continue;

            int v = im->buf[iy*im->stride + ix];

            if (im_samples) {
                im_samples->buf[iy*im_samples->stride + ix] = (1-is_white)*255;
            }

            if (is_white)
                graymodel_add(&whitemodel, tagx, tagy, v);
            else
                graymodel_add(&blackmodel, tagx, tagy, v);
        }
    }

    graymodel_solve(&whitemodel);
    graymodel_solve(&blackmodel);

    // XXX Tunable
    if ((graymodel_interpolate(&whitemodel, 0, 0) - graymodel_interpolate(&blackmodel, 0, 0) < 0) != family->reversed_border) {
        return -1;
    }

    // compute the average decision margin (how far was each bit from
    // the decision boundary?
    //
    // we score this separately for white and black pixels and return
    // the minimum average threshold for black/white pixels. This is
    // to penalize thresholds that are too close to an extreme.
    float black_score = 0, white_score = 0;
    float black_score_count = 1, white_score_count = 1;

    double values[family->total_width*family->total_width];
    memset(values, 0, family->total_width*family->total_width*sizeof(double));

    int min_coord = (family->width_at_border - family->total_width)/2;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];

        double tagx01 = (bitx + 0.5) / (family->width_at_border);
        double tagy01 = (bity + 0.5) / (family->width_at_border);

        // scale to [-1, 1]
        double tagx = 2*(tagx01-0.5);
        double tagy = 2*(tagy01-0.5);

        double px, py;
        homography_project(quad->H, tagx, tagy, &px, &py);

        double v = value_for_pixel(im, px, py);

        if (v == -1) {
            continue;
        }

        double thresh = (graymodel_interpolate(&blackmodel, tagx, tagy) + graymodel_interpolate(&whitemodel, tagx, tagy)) / 2.0;
        values[family->total_width*(bity - min_coord) + bitx - min_coord] = v - thresh;

        if (im_samples) {
            int ix = px;
            int iy = py;
            im_samples->buf[iy*im_samples->stride + ix] = (v < thresh) * 255;
        }
    }

    sharpen(td, values, family->total_width);

    uint64_t rcode = 0;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];
        rcode = (rcode << 1);
        double v = values[(bity - min_coord)*family->total_width + bitx - min_coord];

        if (v > 0) {
            white_score += v;
            white_score_count++;
            rcode |= 1;
        } else {
            black_score -= v;
            black_score_count++;
        }
    }

    quick_decode_codeword(family, rcode, entry);
    return fmin(white_score / white_score_count, black_score / black_score_count);
}